

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

bool absl::str_format_internal::ConvertIntArg<unsigned_short>
               (unsigned_short v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  char *pcVar2;
  ushort uVar3;
  FormatSinkImpl *pFVar4;
  FormatSinkImpl *in_R8;
  char *pcVar5;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  string_view v_00;
  FormatConversionSpecImpl conv_02;
  undefined8 local_60;
  uint local_58;
  char *local_50;
  size_t local_48;
  char local_40 [42];
  char local_16 [6];
  
  pFVar4 = (FormatSinkImpl *)(ulong)v;
  conv_00.width_ = (undefined4)((ulong)register0x00000010 >> 0x20);
  conv_00._0_4_ = conv.precision_;
  conv_02._0_8_ = conv._0_8_;
  conv_00.precision_ = (int)sink;
  local_60 = conv_02._0_8_;
  local_58 = conv_00._0_4_;
  switch((ulong)conv_02._0_8_ & 0xff) {
  case 0:
    local_60._2_1_ = conv.length_mod_;
    if (local_60._2_1_ != l) {
      conv_02.precision_ = conv_00.precision_;
      anon_unknown_53::ConvertCharImpl
                ((char)v,conv_02,(FormatSinkImpl *)&switchD_0019a0d1::switchdataD_001cd4e0);
      return true;
    }
    bVar1 = anon_unknown_53::ConvertWCharTImpl((anon_unknown_53 *)(ulong)v,conv._0_4_,conv_00,in_R8)
    ;
    return bVar1;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = unsigned short]"
                 );
  case 2:
  case 3:
  case 5:
  case 0x12:
    pcVar5 = local_40;
    local_50 = pcVar5;
    pcVar2 = numbers_internal::FastIntToBuffer((uint)v,pcVar5);
    goto LAB_0019a1c4;
  case 4:
    pcVar5 = local_16 + 2;
    do {
      pcVar5[-1] = (byte)pFVar4 & 7 | 0x30;
      pcVar5 = pcVar5 + -1;
      uVar3 = (ushort)pFVar4;
      pFVar4 = (FormatSinkImpl *)((ulong)pFVar4 >> 3);
    } while (7 < uVar3);
    break;
  case 6:
    pcVar5 = local_16 + 3;
    do {
      in_R8 = pFVar4;
      pcVar2 = pcVar5;
      *(undefined2 *)(pcVar2 + -3) =
           *(undefined2 *)(numbers_internal::kHexTable + (ulong)((uint)in_R8 & 0xff) * 2);
      pcVar5 = pcVar2 + -2;
      pFVar4 = (FormatSinkImpl *)((ulong)in_R8 >> 8);
    } while (0xff < (uint)in_R8);
    pcVar5 = pcVar2 + -3;
    if (pcVar2[-3] == '0') {
      pcVar5 = pcVar2 + -2;
    }
    break;
  case 7:
    pcVar5 = local_16 + 2;
    do {
      pcVar5[-1] = "0123456789ABCDEF"[(uint)pFVar4 & 0xf];
      pcVar5 = pcVar5 + -1;
      uVar3 = (ushort)pFVar4;
      pFVar4 = (FormatSinkImpl *)((ulong)pFVar4 >> 4);
    } while (0xf < uVar3);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    bVar1 = ConvertFloatImpl((double)v,(FormatConversionSpecImpl *)&local_60,sink);
    return bVar1;
  }
  pcVar2 = local_16 + 2;
  local_50 = pcVar5;
LAB_0019a1c4:
  local_48 = (long)pcVar2 - (long)pcVar5;
  if (local_60._1_1_ == kBasic) {
    v_00._M_str = local_50;
    v_00._M_len = local_48;
    FormatSinkImpl::Append(sink,v_00);
  }
  else {
    conv_01.width_ = 0;
    conv_01.conv_ = (undefined1)local_58;
    conv_01.flags_ = local_58._1_1_;
    conv_01.length_mod_ = local_58._2_1_;
    conv_01._3_1_ = local_58._3_1_;
    conv_01.precision_ = conv_00.precision_;
    anon_unknown_53::ConvertIntImplInnerSlow((anon_unknown_53 *)&local_50,local_60,conv_01,in_R8);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}